

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Return_AST_Node::eval_internal(Return_AST_Node *this,Dispatch_State *t_ss)

{
  Dispatch_Engine *pDVar1;
  Dispatch_Engine *pDVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pDVar1 = t_ss[3].m_engine._M_data;
  pDVar2 = (Dispatch_Engine *)t_ss[3].m_stack_holder._M_data;
  puVar5 = (undefined8 *)__cxa_allocate_exception(0x10);
  if (pDVar1 == pDVar2) {
    puVar6 = (undefined8 *)operator_new(0x50);
    puVar6[1] = 0x100000001;
    *puVar6 = &PTR___Sp_counted_ptr_inplace_0030d160;
    puVar6[2] = 0;
    puVar6[3] = 0;
    *(undefined4 *)(puVar6 + 4) = 0x20;
    puVar6[5] = 0;
    puVar6[6] = 0;
    puVar6[7] = 0;
    puVar6[8] = 0;
    *(undefined2 *)(puVar6 + 9) = 0;
    *puVar5 = puVar6 + 2;
    puVar5[1] = puVar6;
    __cxa_throw(puVar5,&detail::Return_Value::typeinfo,detail::Return_Value::~Return_Value);
  }
  AST_Node::eval((AST_Node *)&stack0xffffffffffffffc8,
                 (Dispatch_State *)
                 ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                 __align);
  uVar3 = uStack_30;
  uVar4 = uStack_2c;
  _uStack_30 = (element_type *)0x0;
  *(undefined4 *)puVar5 = local_38;
  *(undefined4 *)((long)puVar5 + 4) = uStack_34;
  *(undefined4 *)(puVar5 + 1) = uVar3;
  *(undefined4 *)((long)puVar5 + 0xc) = uVar4;
  _local_38 = (_func_int **)0x0;
  __cxa_throw(puVar5,&detail::Return_Value::typeinfo,detail::Return_Value::~Return_Value);
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          if (!this->children.empty()) {
            throw detail::Return_Value(children[0]->eval(t_ss));
          }
          else {
            throw detail::Return_Value(Boxed_Value());
          }
        }